

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_scan.hpp
# Opt level: O2

void __thiscall
duckdb::AlpRDScanState<float>::ScanVector<unsigned_int,false>
          (AlpRDScanState<float> *this,uint *values,idx_t vector_size)

{
  if (((this->total_value_count & 0x3ff) == 0) && (this->total_value_count < this->count)) {
    if (vector_size == 0x400) {
      LoadVector<false>(this,values);
      vector_size = 0x400;
      goto LAB_004d7a73;
    }
    LoadVector<false>(this,(this->vector_state).decoded_values);
  }
  switchD_00916250::default
            (values,(this->vector_state).decoded_values + (this->vector_state).index,vector_size * 4
            );
  (this->vector_state).index = (this->vector_state).index + vector_size;
LAB_004d7a73:
  this->total_value_count = this->total_value_count + vector_size;
  return;
}

Assistant:

void ScanVector(EXACT_TYPE *values, idx_t vector_size) {
		D_ASSERT(vector_size <= AlpRDConstants::ALP_VECTOR_SIZE);
		D_ASSERT(vector_size <= LeftInVector());
		if (VectorFinished() && total_value_count < count) {
			if (vector_size == AlpRDConstants::ALP_VECTOR_SIZE) {
				LoadVector<SKIP>(values);
				total_value_count += vector_size;
				return;
			} else {
				// Even if SKIP is given, the vector size is not big enough to be able to fully skip the entire vector
				LoadVector<false>(vector_state.decoded_values);
			}
		}
		vector_state.template Scan<SKIP>((uint8_t *)values, vector_size);

		total_value_count += vector_size;
	}